

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_rkv_reg.c
# Opt level: O1

MPP_RET rkv_h264d_gen_regs(void *hal,HalTaskInfo *task)

{
  ushort uVar1;
  RK_U64 *pRVar2;
  ushort *puVar3;
  void *__s;
  int iVar4;
  uint uVar5;
  RK_U32 RVar6;
  RK_U32 RVar7;
  uint uVar8;
  RK_U64 *pRVar9;
  ulong uVar10;
  undefined4 *puVar11;
  long lVar12;
  ulong uVar13;
  size_t offset;
  long lVar14;
  RK_U64 RVar15;
  ulong uVar16;
  uint uVar17;
  byte bVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  BitputCtx_t bp;
  uint local_78;
  MppFrame local_70 [4];
  RK_U64 *local_50;
  RK_U64 *local_48;
  RK_U64 *local_40;
  HalTaskInfo *local_38;
  
  if (hal == (void *)0x0) {
    if (((byte)hal_h264d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h264d_rkv_reg","input empty(%d).\n",(char *)0x0,0x278);
    }
  }
  else if ((((task->dec).flags.val & 4) == 0) &&
          ((((task->dec).flags.val & 8) == 0 || (*(int *)(*(long *)((long)hal + 0x60) + 0x30) != 0))
          )) {
    pRVar2 = *(RK_U64 **)((long)hal + 0x90);
    if (*(int *)((long)hal + 0x98) != 0) {
      pRVar9 = pRVar2 + 0x52;
      lVar12 = 0;
      do {
        if ((int)*pRVar9 == 0) {
          (task->dec).reg_index = (RK_S32)lVar12;
          pRVar2[0x61] = pRVar9[1];
          pRVar2[0x62] = pRVar9[2];
          pRVar2[99] = pRVar9[3];
          pRVar2[100] = pRVar9[4];
          *(int *)pRVar9 = 1;
          break;
        }
        lVar12 = lVar12 + 1;
        pRVar9 = pRVar9 + 5;
      } while (lVar12 != 3);
    }
    puVar3 = *(ushort **)((long)hal + 8);
    local_38 = task;
    mpp_set_bitput_ctx((BitputCtx_t *)local_70,pRVar2,0x20);
    mpp_put_bits((BitputCtx_t *)local_70,0xffffffffffffffff,4);
    mpp_put_bits((BitputCtx_t *)local_70,0xffffffffffffffff,8);
    mpp_put_bits((BitputCtx_t *)local_70,0xffffffffffffffff,1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(puVar3[3] >> 4 & 3),2);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[4],3);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 9),3);
    RVar15 = 0;
    mpp_put_bits((BitputCtx_t *)local_70,0,1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x7c],4);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 5),5);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 0xf9),2);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x7d],4);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 0xfb),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*puVar3 + 1,9);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)puVar3[1] + 1,9);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(puVar3[3] >> 0xc & 1),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(puVar3[3] >> 1 & 1),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x7e],1);
    mpp_put_bits((BitputCtx_t *)local_70,1,1);
    mpp_put_bits((BitputCtx_t *)local_70,(long)(char)puVar3[0x83] + 1,2);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)puVar3[0x84],10);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)puVar3[0x85],10);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x94],1);
    if ((char)puVar3[0x94] != '\0') {
      RVar15 = (RK_U64)puVar3[0x9c];
    }
    mpp_put_bits((BitputCtx_t *)local_70,RVar15,10);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x19c],1);
    if ((char)puVar3[0x19c] == '\0') {
      RVar15 = 0;
    }
    else {
      RVar15 = (RK_U64)puVar3[0x1a4];
    }
    mpp_put_bits((BitputCtx_t *)local_70,RVar15,10);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x2a4],1);
    if ((char)puVar3[0x2a4] == '\0') {
      RVar15 = 0;
    }
    else {
      RVar15 = (RK_U64)puVar3[0x2ac];
    }
    mpp_put_bits((BitputCtx_t *)local_70,RVar15,10);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x3ac],1);
    if ((char)puVar3[0x3ac] == '\0') {
      RVar15 = 0;
    }
    else {
      RVar15 = (RK_U64)puVar3[0x3b4];
    }
    mpp_put_bits((BitputCtx_t *)local_70,RVar15,10);
    mpp_put_align((BitputCtx_t *)local_70,0x20,0);
    lVar12 = *(long *)((long)hal + 0x90);
    mpp_put_bits((BitputCtx_t *)local_70,0xffffffffffffffff,8);
    mpp_put_bits((BitputCtx_t *)local_70,0xffffffffffffffff,5);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 0xfd),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x7f],1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 0xad),5);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x57],5);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(*(byte *)((long)puVar3 + 7) & 1),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(puVar3[3] >> 9 & 3),2);
    mpp_put_bits((BitputCtx_t *)local_70,(long)(char)puVar3[0x56],7);
    mpp_put_bits((BitputCtx_t *)local_70,(long)(char)puVar3[0x54],6);
    mpp_put_bits((BitputCtx_t *)local_70,(long)*(char *)((long)puVar3 + 0xa9),5);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)((long)puVar3 + 0x101),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(puVar3[3] >> 7 & 1),1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x81],1);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(puVar3[3] >> 0xd & 1),1);
    mpp_put_bits((BitputCtx_t *)local_70,(long)(char)puVar3[0x55],5);
    mpp_put_bits((BitputCtx_t *)local_70,(ulong)(byte)puVar3[0x4d1],1);
    iVar4 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar12 + 0x318),"prepare_spspps");
    mpp_put_bits((BitputCtx_t *)local_70,(long)iVar4,0x20);
    lVar12 = 0;
    do {
      bVar18 = *(byte *)((long)puVar3 + lVar12 + 0x10);
      uVar5 = (uint)(bVar18 >> 7);
      if (bVar18 == 0xff) {
        uVar5 = 0;
      }
      mpp_put_bits((BitputCtx_t *)local_70,(ulong)uVar5,1);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x10);
    lVar12 = 0;
    do {
      if (*(char *)((long)puVar3 + lVar12 + 0x10) == -1) {
        RVar15 = 0;
      }
      else {
        RVar15 = (RK_U64)*(byte *)((long)puVar3 + lVar12 + 0x992);
      }
      mpp_put_bits((BitputCtx_t *)local_70,RVar15,1);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x10);
    lVar19 = 0;
    mpp_put_align((BitputCtx_t *)local_70,0x40,0);
    local_40 = pRVar2 + 4;
    lVar12 = *(long *)((long)hal + 8);
    local_48 = pRVar2;
    mpp_set_bitput_ctx((BitputCtx_t *)local_70,local_40,0x100);
    bVar18 = *(byte *)(lVar12 + 0xf8);
    do {
      if ((*(ushort *)(lVar12 + 0xf4) >> ((uint)lVar19 & 0x1f) & 1) == 0) {
        uVar1 = *(ushort *)(lVar12 + 0xb0 + lVar19 * 2);
        uVar5 = (uint)uVar1;
        if (-1 < *(char *)(lVar12 + 0x10 + lVar19)) {
          iVar4 = -0x10 << (bVar18 & 0x1f);
          if (uVar1 <= *(ushort *)(lVar12 + 0xf6)) {
            iVar4 = 0;
          }
          uVar5 = uVar5 + iVar4;
        }
      }
      else {
        uVar5 = 0;
      }
      mpp_put_bits((BitputCtx_t *)local_70,(ulong)(uVar5 & 0xffff),0x10);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x10);
    iVar4 = 0x10;
    do {
      mpp_put_bits((BitputCtx_t *)local_70,0,1);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    lVar19 = 0;
    do {
      mpp_put_bits((BitputCtx_t *)local_70,(ulong)*(byte *)(lVar12 + 0x992 + lVar19),1);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x10);
    lVar19 = 0;
    do {
      bVar18 = *(byte *)(*(long *)((long)hal + 0x28) + 0x11 + lVar19);
      uVar5 = (uint)(bVar18 & 0x7f);
      if (bVar18 == 0xff) {
        uVar5 = 0;
      }
      uVar8 = (uint)(bVar18 >> 7);
      if (bVar18 == 0xff) {
        uVar8 = 0;
      }
      if (bVar18 == 0xff) {
        uVar16 = 0;
        RVar15 = 0;
      }
      else {
        RVar15 = (RK_U64)*(byte *)(lVar12 + 0x992 + (ulong)uVar5);
        uVar16 = 0x10;
      }
      mpp_put_bits((BitputCtx_t *)local_70,uVar16 | uVar5,5);
      mpp_put_bits((BitputCtx_t *)local_70,(ulong)uVar8,1);
      mpp_put_bits((BitputCtx_t *)local_70,RVar15,1);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x20);
    lVar19 = 1;
    lVar20 = 0x31;
    do {
      lVar14 = 0;
      local_50 = (RK_U64 *)lVar19;
      do {
        bVar18 = *(byte *)(lVar14 + *(long *)((long)hal + 0x28) + lVar20);
        uVar5 = (uint)(bVar18 & 0x7f);
        if (bVar18 == 0xff) {
          uVar5 = 0;
        }
        uVar8 = (uint)(bVar18 >> 7);
        if (bVar18 == 0xff) {
          uVar8 = 0;
        }
        if (bVar18 == 0xff) {
          uVar16 = 0;
          RVar15 = 0;
        }
        else {
          RVar15 = (RK_U64)*(byte *)(lVar12 + 0x992 + (ulong)uVar5);
          uVar16 = 0x10;
        }
        mpp_put_bits((BitputCtx_t *)local_70,uVar16 | uVar5,5);
        mpp_put_bits((BitputCtx_t *)local_70,(ulong)uVar8,1);
        mpp_put_bits((BitputCtx_t *)local_70,RVar15,1);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x20);
      lVar19 = (long)local_50 + 1;
      lVar20 = lVar20 + 0x20;
    } while (lVar19 != 3);
    mpp_put_align((BitputCtx_t *)local_70,0x80,0);
    pRVar2 = local_48;
    local_50 = local_48 + 0x24;
    if (*(char *)(*(long *)((long)hal + 8) + 0x9a2) != '\0') {
      mpp_set_bitput_ctx((BitputCtx_t *)local_70,local_50,0x160);
      lVar12 = 0;
      lVar19 = 0;
      do {
        lVar20 = 0;
        do {
          mpp_put_bits((BitputCtx_t *)local_70,
                       (ulong)*(byte *)(lVar20 + *(long *)((long)hal + 0x10) + lVar12),8);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x10);
        lVar19 = lVar19 + 1;
        lVar12 = lVar12 + 0x10;
      } while (lVar19 != 6);
      lVar19 = 0x60;
      lVar12 = 0;
      do {
        lVar20 = 0;
        do {
          mpp_put_bits((BitputCtx_t *)local_70,
                       (ulong)*(byte *)(lVar20 + *(long *)((long)hal + 0x10) + lVar19),8);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x40);
        lVar19 = lVar19 + 0x40;
        bVar21 = lVar12 == 0;
        lVar12 = lVar12 + 1;
      } while (bVar21);
    }
    __s = (void *)pRVar2[100];
    lVar12 = *(long *)((long)hal + 8);
    memset(__s,0,0x140);
    uVar5 = *(uint *)((long)__s + 8);
    *(uint *)((long)__s + 8) = uVar5 & 0xffcfffff | 0x100000;
    if ((uVar5 >> 0xb & 1) == 0) {
      *(uint *)((long)__s + 0x14) =
           *(uint *)((long)__s + 0x14) & 0xf8000000 | *(uint *)((long)hal + 0x38) & 0x7ffffff;
    }
    else {
      *(uint *)((long)__s + 0x14) = *(uint *)((long)__s + 0x14) & 0xf8000000;
    }
    if ((uVar5 >> 0x18 & 1) != 0) {
      *(int *)((long)__s + 0xac) = *(int *)((long)__s + 0xac) + 8;
    }
    *(uint *)((long)__s + 0xc) = *(uint *)((long)__s + 0xc) | 0xffe00800;
    local_70[0] = (MppFrame)0x0;
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x50),*(byte *)(lVar12 + 4) & 0x7f,SLOT_FRAME_PTR,
               local_70);
    RVar6 = mpp_frame_get_hor_stride(local_70[0]);
    RVar7 = mpp_frame_get_ver_stride(local_70[0]);
    uVar8 = RVar7 * RVar6;
    uVar5 = uVar8;
    switch(*(ushort *)(lVar12 + 6) >> 4 & 3) {
    case 1:
      uVar5 = (uVar8 >> 1) + uVar8;
      break;
    case 2:
      uVar5 = uVar8 * 2;
      break;
    case 3:
      uVar5 = 0;
    }
    uVar17 = RVar6 >> 4 & 0x1ff;
    *(uint *)((long)__s + 0xc) = uVar17 << 0xc | *(uint *)((long)__s + 0xc) & 0xffe00e00 | uVar17;
    *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfff00000 | uVar8 >> 4 & 0xfffff;
    *(uint *)((long)__s + 0x24) = *(uint *)((long)__s + 0x24) & 0xffe00000 | uVar5 >> 4 & 0x1fffff;
    bVar18 = 0;
    local_70[0] = (MppBuffer)0x0;
    *(undefined4 *)((long)__s + 0xa0) = *(undefined4 *)(lVar12 + 0x20);
    *(undefined4 *)((long)__s + 0x128) = *(undefined4 *)(lVar12 + 0x24);
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x50),*(byte *)(lVar12 + 4) & 0x7f,SLOT_BUFFER,local_70)
    ;
    iVar4 = mpp_buffer_get_fd_with_caller(local_70[0],"set_registers");
    *(int *)((long)__s + 0x1c) = iVar4;
    local_70[0] = (MppBuffer)0x0;
    local_78 = 0xffffffff;
    uVar16 = 0;
    do {
      uVar5 = (uint)uVar16;
      uVar10 = uVar16 >> 1 & 0x7fffffff;
      uVar13 = (ulong)(uVar5 + 0xf >> 1);
      bVar21 = (uVar16 & 1) == 0;
      puVar11 = (undefined4 *)(lVar12 + 0x2c + uVar10 * 8);
      if (bVar21) {
        puVar11 = (undefined4 *)(lVar12 + 0x28 + uVar10 * 8);
      }
      *(undefined4 *)((long)__s + uVar16 * 4 + 100) = *puVar11;
      puVar11 = (undefined4 *)(lVar12 + 0x2c + uVar13 * 8);
      if (!bVar21) {
        puVar11 = (undefined4 *)(lVar12 + 0x28 + uVar13 * 8);
      }
      *(undefined4 *)((long)__s + uVar16 * 4 + 0xc4) = *puVar11;
      mpp_dev_set_reg_offset
                (*(MppDev *)((long)hal + 0x88),uVar5 + 10,
                 (uint)((*(ushort *)(lVar12 + 0x990) >> (uVar5 & 0x1f) & 1) != 0) +
                 (*(uint *)(lVar12 + 0xf0) >> (bVar18 & 0x1f) & 1) * 2 +
                 (*(uint *)(lVar12 + 0xf0) >> (bVar18 + 1 & 0x1f) & 1) * 4 +
                 (*(ushort *)(lVar12 + 0x98e) >> ((byte)uVar16 & 0x1f) & 1) * 8);
      uVar5 = (uint)*(byte *)(lVar12 + 0x10 + uVar16);
      if (uVar5 == 0xff) {
        uVar5 = local_78;
        if ((int)local_78 < 0) {
          uVar5 = *(byte *)(lVar12 + 4) & 0x7f;
        }
      }
      else {
        local_78 = uVar5 & 0x7f;
        uVar5 = local_78;
      }
      mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x50),uVar5,SLOT_BUFFER,local_70);
      iVar4 = mpp_buffer_get_fd_with_caller(local_70[0],"set_registers");
      *(int *)((long)__s + uVar16 * 4 + 0x28) = iVar4;
      uVar16 = uVar16 + 1;
      bVar18 = bVar18 + 2;
    } while (uVar16 != 0xf);
    *(undefined4 *)((long)__s + 0x120) = *(undefined4 *)(lVar12 + 0xa0);
    *(undefined4 *)((long)__s + 0x124) = *(undefined4 *)(lVar12 + 0xa4);
    mpp_dev_set_reg_offset
              (*(MppDev *)((long)hal + 0x88),0x30,
               *(ushort *)(lVar12 + 0x98e) >> 0xc & 8 |
               (uint)(*(ushort *)(lVar12 + 0x990) >> 0xf) + (*(uint *)(lVar12 + 0xf0) >> 0x1e) * 2);
    if (*(byte *)(lVar12 + 0x1f) == 0xff) {
      if ((int)local_78 < 0) {
        local_78 = *(byte *)(lVar12 + 4) & 0x7f;
      }
    }
    else {
      local_78 = *(byte *)(lVar12 + 0x1f) & 0x7f;
    }
    mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x50),local_78,SLOT_BUFFER,local_70);
    iVar4 = mpp_buffer_get_fd_with_caller(local_70[0],"set_registers");
    *(int *)((long)__s + 0xc0) = iVar4;
    local_70[0] = (MppBuffer)0x0;
    lVar12 = *(long *)((long)hal + 0x90);
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)((long)hal + 0x58),(local_38->dec).input,SLOT_BUFFER,local_70);
    iVar4 = mpp_buffer_get_fd_with_caller(local_70[0],"set_registers");
    *(int *)((long)__s + 0x10) = iVar4;
    iVar4 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)(lVar12 + 0x280),"set_registers");
    pRVar2 = local_48;
    *(int *)((long)__s + 0x18) = iVar4;
    *(undefined4 *)((long)__s + 0xa4) = *(undefined4 *)((long)__s + 0x10);
    offset = 0;
    do {
      mpp_buffer_write_with_caller((MppBuffer)pRVar2[0x61],offset,pRVar2,0x20,"rkv_h264d_gen_regs");
      offset = offset + 0x20;
    } while (offset != 0x2000);
    iVar4 = mpp_buffer_get_fd_with_caller((MppBuffer)pRVar2[0x61],"rkv_h264d_gen_regs");
    *(int *)(pRVar2[100] + 0xa8) = iVar4;
    mpp_buffer_write_with_caller((MppBuffer)pRVar2[0x62],0,local_40,0x100,"rkv_h264d_gen_regs");
    iVar4 = mpp_buffer_get_fd_with_caller((MppBuffer)pRVar2[0x62],"rkv_h264d_gen_regs");
    *(int *)(pRVar2[100] + 0xac) = iVar4;
    mpp_buffer_write_with_caller((MppBuffer)pRVar2[99],0,local_50,0x160,"rkv_h264d_gen_regs");
    iVar4 = mpp_buffer_get_fd_with_caller((MppBuffer)pRVar2[0x51],"rkv_h264d_gen_regs");
    *(int *)(pRVar2[100] + 300) = iVar4;
    mpp_buffer_sync_end_f((MppBuffer)pRVar2[0x61],0,"rkv_h264d_gen_regs");
    mpp_buffer_sync_end_f((MppBuffer)pRVar2[0x62],0,"rkv_h264d_gen_regs");
    mpp_buffer_sync_end_f((MppBuffer)pRVar2[99],0,"rkv_h264d_gen_regs");
  }
  return MPP_OK;
}

Assistant:

MPP_RET rkv_h264d_gen_regs(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;

    INP_CHECK(ret, NULL == p_hal);

    if (task->dec.flags.parse_err ||
        (task->dec.flags.ref_err && !p_hal->cfg->base.disable_error)) {
        goto __RETURN;
    }
    H264dRkvRegCtx_t *reg_ctx = (H264dRkvRegCtx_t *)p_hal->reg_ctx;
    if (p_hal->fast_mode) {
        RK_U32 i = 0;
        for (i = 0; i <  MPP_ARRAY_ELEMS(reg_ctx->reg_buf); i++) {
            if (!reg_ctx->reg_buf[i].valid) {
                task->dec.reg_index = i;
                reg_ctx->spspps_buf = reg_ctx->reg_buf[i].spspps;
                reg_ctx->rps_buf = reg_ctx->reg_buf[i].rps;
                reg_ctx->sclst_buf = reg_ctx->reg_buf[i].sclst;
                reg_ctx->regs = reg_ctx->reg_buf[i].regs;
                reg_ctx->reg_buf[i].valid = 1;
                break;
            }
        }
    }

    prepare_spspps(p_hal, (RK_U64 *)&reg_ctx->spspps, sizeof(reg_ctx->spspps));
    prepare_framerps(p_hal, (RK_U64 *)&reg_ctx->rps, sizeof(reg_ctx->rps));
    prepare_scanlist(p_hal, (RK_U64 *)&reg_ctx->sclst, sizeof(reg_ctx->sclst));
    set_registers(p_hal, reg_ctx->regs, task);

    //!< copy datas
    RK_U32 i = 0;
    for (i = 0; i < 256; i++) {
        mpp_buffer_write(reg_ctx->spspps_buf,
                         (sizeof(reg_ctx->spspps) * i), (void *)reg_ctx->spspps,
                         sizeof(reg_ctx->spspps));
    }
    reg_ctx->regs->sw42.pps_base = mpp_buffer_get_fd(reg_ctx->spspps_buf);

    mpp_buffer_write(reg_ctx->rps_buf, 0,
                     (void *)reg_ctx->rps, sizeof(reg_ctx->rps));
    reg_ctx->regs->sw43.rps_base = mpp_buffer_get_fd(reg_ctx->rps_buf);

    mpp_buffer_write(reg_ctx->sclst_buf, 0,
                     (void *)reg_ctx->sclst, sizeof(reg_ctx->sclst));
    reg_ctx->regs->sw75.errorinfo_base = mpp_buffer_get_fd(reg_ctx->errinfo_buf);
    mpp_buffer_sync_end(reg_ctx->spspps_buf);
    mpp_buffer_sync_end(reg_ctx->rps_buf);
    mpp_buffer_sync_end(reg_ctx->sclst_buf);

__RETURN:
    return ret = MPP_OK;
}